

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O0

DeviceTy * __thiscall DeviceTy::operator=(DeviceTy *this,DeviceTy *d)

{
  map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  *in_RSI;
  DeviceTy *in_RDI;
  
  in_RDI->DeviceID = *(int32_t *)&(in_RSI->_M_t)._M_impl;
  in_RDI->RTL = *(RTLInfoTy **)&(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header;
  in_RDI->RTLDeviceID =
       *(int32_t *)&(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  in_RDI->IsInit =
       (bool)(*(byte *)((long)&(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent + 4)
             & 1);
  in_RDI->HasPendingGlobals =
       (bool)(*(byte *)((long)&(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 4) &
             1);
  std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::operator=
            ((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)this,
             (list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)d);
  std::
  map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  ::operator=(in_RSI,(map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                      *)in_RDI);
  std::
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  ::operator=((map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               *)in_RSI,
              (map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               *)in_RDI);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  operator=((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             *)in_RSI,
            (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             *)in_RDI);
  in_RDI->RTLRequiresFlags =
       (int64_t)((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  *)in_RSI)[6]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  return in_RDI;
}

Assistant:

DeviceTy& operator=(const DeviceTy &d) {
    DeviceID = d.DeviceID;
    RTL = d.RTL;
    RTLDeviceID = d.RTLDeviceID;
    IsInit = d.IsInit;
    HasPendingGlobals = d.HasPendingGlobals;
    HostDataToTargetMap = d.HostDataToTargetMap;
    PendingCtorsDtors = d.PendingCtorsDtors;
    ShadowPtrMap = d.ShadowPtrMap;
    LoopTripCnt = d.LoopTripCnt;
    RTLRequiresFlags = d.RTLRequiresFlags;

    return *this;
  }